

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void cpool_shutdown_discard_all(cpool *cpool)

{
  connectdata *conn_00;
  connectdata *conn;
  Curl_llist_node *e;
  cpool *cpool_local;
  
  conn = (connectdata *)Curl_llist_head(&cpool->shutdowns);
  if (conn != (connectdata *)0x0) {
    while (conn != (connectdata *)0x0) {
      conn_00 = (connectdata *)Curl_node_elem(&conn->cpool_node);
      Curl_node_remove(&conn->cpool_node);
      cpool_close_and_destroy(cpool,conn_00,(Curl_easy *)0x0,false);
      conn = (connectdata *)Curl_llist_head(&cpool->shutdowns);
    }
  }
  return;
}

Assistant:

static void cpool_shutdown_discard_all(struct cpool *cpool)
{
  struct Curl_llist_node *e = Curl_llist_head(&cpool->shutdowns);
  struct connectdata *conn;

  if(!e)
    return;

  DEBUGF(infof(cpool->idata, "cpool_shutdown_discard_all"));
  while(e) {
    conn = Curl_node_elem(e);
    Curl_node_remove(e);
    DEBUGF(infof(cpool->idata, "discard connection #%" FMT_OFF_T,
                 conn->connection_id));
    cpool_close_and_destroy(cpool, conn, NULL, FALSE);
    e = Curl_llist_head(&cpool->shutdowns);
  }
}